

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

void __thiscall despot::POMDPX::InitStates(POMDPX *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  pointer ppPVar3;
  log_ostream *plVar4;
  ostream *poVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  timeval tv;
  vector<int,_std::allocator<int>_> local_38;
  
  if (this->is_small_ == false) {
    __assert_fail("is_small_",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                  ,0x126,"void despot::POMDPX::InitStates()");
  }
  gettimeofday((timeval *)&local_38,(__timezone_ptr_t)0x0);
  dVar7 = (double)(long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
  dVar8 = (double)(long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
  iVar1 = (*(this->super_MDP)._vptr_MDP[2])(this);
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::resize
            (&this->states_,(long)iVar1);
  if ((this->states_).
      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->states_).
      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      iVar1 = (*(this->super_MDP)._vptr_MDP[0x19])(0,this,uVar6 & 0xffffffff);
      Parser::ComputeState(&local_38,this->parser_,(int)uVar6);
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                (&((POMDPXState *)CONCAT44(extraout_var,iVar1))->vec_id,&local_38);
      if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      (this->states_).
      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = (POMDPXState *)CONCAT44(extraout_var,iVar1);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(this->states_).
                                   super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->states_).
                                   super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppPVar3 = (this->states_).
            super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->states_).
      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar3) {
    uVar6 = 0;
    do {
      uVar2 = (*(this->super_MDP)._vptr_MDP[9])(this,ppPVar3[uVar6]);
      if (uVar6 != uVar2) {
        __assert_fail("GetIndex(states_[s]) == s",
                      "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                      ,0x132,"void despot::POMDPX::InitStates()");
      }
      uVar6 = uVar6 + 1;
      ppPVar3 = (this->states_).
                super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->states_).
                                   super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3))
    ;
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar4 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar4->super_ostream,"[POMDPX::InitState] Initialized state table in ",0x2f);
      gettimeofday((timeval *)&local_38,(__timezone_ptr_t)0x0);
      poVar5 = std::ostream::_M_insert<double>
                         (((double)(long)local_38.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish / 1000000.0 +
                          (double)(long)local_38.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) -
                          (dVar8 / 1000000.0 + dVar7));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void POMDPX::InitStates() {
	assert(is_small_);

	double start = get_time_second();
	states_.resize(NumStates());

	for (int s = 0; s < states_.size(); s++) {
		POMDPXState* state = static_cast<POMDPXState*>(Allocate(s, 0));
		state->vec_id = parser_->ComputeState(s);
		states_[s] = state;
	}

	for (int s = 0; s < states_.size(); s++)
		assert(GetIndex(states_[s]) == s);

	logi << "[POMDPX::InitState] Initialized state table in "
		<< (get_time_second() - start) << "s" << endl;
}